

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioaWriteAig.c
# Opt level: O3

char * Ioa_WriteAigerIntoMemory(Aig_Man_t *pMan,int *pnSize)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  size_t __size;
  Vec_Str_t *__ptr;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  
  __ptr = Ioa_WriteAigerIntoMemoryStr(pMan);
  if (pMan->pName != (char *)0x0) {
    uVar2 = __ptr->nSize;
    if (uVar2 == __ptr->nCap) {
      if ((int)uVar2 < 0x10) {
        if (__ptr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(__ptr->pArray,0x10);
        }
        __ptr->pArray = pcVar4;
        __ptr->nCap = 0x10;
      }
      else {
        sVar5 = (ulong)uVar2 * 2;
        if (__ptr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar5);
        }
        else {
          pcVar4 = (char *)realloc(__ptr->pArray,sVar5);
        }
        __ptr->pArray = pcVar4;
        __ptr->nCap = (int)sVar5;
      }
    }
    else {
      pcVar4 = __ptr->pArray;
    }
    iVar3 = __ptr->nSize;
    __ptr->nSize = iVar3 + 1;
    pcVar4[iVar3] = 'n';
    pcVar4 = pMan->pName;
    sVar5 = strlen(pcVar4);
    if (0 < (int)(uint)sVar5) {
      uVar7 = 0;
      do {
        cVar1 = pcVar4[uVar7];
        uVar2 = __ptr->nSize;
        if (uVar2 == __ptr->nCap) {
          if ((int)uVar2 < 0x10) {
            if (__ptr->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(0x10);
            }
            else {
              pcVar6 = (char *)realloc(__ptr->pArray,0x10);
            }
            __ptr->pArray = pcVar6;
            __ptr->nCap = 0x10;
          }
          else {
            __size = (ulong)uVar2 * 2;
            if (__ptr->pArray == (char *)0x0) {
              pcVar6 = (char *)malloc(__size);
            }
            else {
              pcVar6 = (char *)realloc(__ptr->pArray,__size);
            }
            __ptr->pArray = pcVar6;
            __ptr->nCap = (int)__size;
          }
        }
        else {
          pcVar6 = __ptr->pArray;
        }
        iVar3 = __ptr->nSize;
        __ptr->nSize = iVar3 + 1;
        pcVar6[iVar3] = cVar1;
        uVar7 = uVar7 + 1;
      } while (((uint)sVar5 & 0x7fffffff) != uVar7);
    }
    uVar2 = __ptr->nSize;
    if (uVar2 == __ptr->nCap) {
      if ((int)uVar2 < 0x10) {
        if (__ptr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(0x10);
        }
        else {
          pcVar4 = (char *)realloc(__ptr->pArray,0x10);
        }
        __ptr->pArray = pcVar4;
        __ptr->nCap = 0x10;
      }
      else {
        sVar5 = (ulong)uVar2 * 2;
        if (__ptr->pArray == (char *)0x0) {
          pcVar4 = (char *)malloc(sVar5);
        }
        else {
          pcVar4 = (char *)realloc(__ptr->pArray,sVar5);
        }
        __ptr->pArray = pcVar4;
        __ptr->nCap = (int)sVar5;
      }
    }
    else {
      pcVar4 = __ptr->pArray;
    }
    iVar3 = __ptr->nSize;
    __ptr->nSize = iVar3 + 1;
    pcVar4[iVar3] = '\0';
  }
  *pnSize = __ptr->nSize;
  pcVar4 = __ptr->pArray;
  free(__ptr);
  return pcVar4;
}

Assistant:

char * Ioa_WriteAigerIntoMemory( Aig_Man_t * pMan, int * pnSize )
{
    char * pBuffer;
    Vec_Str_t * vBuffer;
    vBuffer = Ioa_WriteAigerIntoMemoryStr( pMan );
    if ( pMan->pName )
    {
        Vec_StrPrintStr( vBuffer, "n" );
        Vec_StrPrintStr( vBuffer, pMan->pName );
        Vec_StrPush( vBuffer, 0 );
    }
    // prepare the return values
    *pnSize = Vec_StrSize( vBuffer );
    pBuffer = Vec_StrReleaseArray( vBuffer );
    Vec_StrFree( vBuffer );
    return pBuffer;
}